

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O0

char * get_apple_string(FT_Memory memory,FT_Stream stream,TT_Name entry,char_type_func char_type,
                       FT_Bool report_invalid_characters)

{
  int iVar1;
  char *P;
  uint local_54;
  char *pcStack_50;
  FT_UInt len;
  FT_Char *p;
  FT_String *r;
  char *result;
  FT_Error error;
  FT_Bool report_invalid_characters_local;
  char_type_func char_type_local;
  TT_Name entry_local;
  FT_Stream stream_local;
  FT_Memory memory_local;
  
  result._7_1_ = report_invalid_characters;
  _error = char_type;
  char_type_local = (char_type_func)entry;
  entry_local = (TT_Name)stream;
  stream_local = (FT_Stream)memory;
  P = (char *)ft_mem_qalloc(memory,(long)(int)(entry->stringLength + 1),(FT_Error *)&result);
  if ((FT_Error)result == 0) {
    result._0_4_ = FT_Stream_Seek((FT_Stream)entry_local,*(FT_ULong *)(char_type_local + 0x10));
    if (((FT_Error)result == 0) &&
       (result._0_4_ = FT_Stream_EnterFrame
                                 ((FT_Stream)entry_local,(ulong)*(ushort *)(char_type_local + 8)),
       (FT_Error)result == 0)) {
      pcStack_50 = *(char **)(entry_local + 2);
      local_54 = (uint)*(ushort *)(char_type_local + 8);
      p = P;
      while ((local_54 != 0 && (iVar1 = (*_error)((int)*pcStack_50), iVar1 != 0))) {
        *p = *pcStack_50;
        local_54 = local_54 - 1;
        pcStack_50 = pcStack_50 + 1;
        p = p + 1;
      }
      if (local_54 == 0) {
        *p = '\0';
      }
      FT_Stream_ExitFrame((FT_Stream)entry_local);
      if (local_54 == 0) {
        return P;
      }
    }
    ft_mem_free((FT_Memory)stream_local,P);
    *(undefined8 *)(char_type_local + 0x10) = 0;
    *(undefined2 *)(char_type_local + 8) = 0;
    ft_mem_free((FT_Memory)stream_local,*(void **)(char_type_local + 0x18));
    *(undefined8 *)(char_type_local + 0x18) = 0;
  }
  return (char *)0x0;
}

Assistant:

static char*
  get_apple_string( FT_Memory       memory,
                    FT_Stream       stream,
                    TT_Name         entry,
                    char_type_func  char_type,
                    FT_Bool         report_invalid_characters )
  {
    FT_Error  error;

    char*       result = NULL;
    FT_String*  r;
    FT_Char*    p;
    FT_UInt     len;


    if ( FT_QALLOC( result, entry->stringLength + 1 ) )
      return NULL;

    if ( FT_STREAM_SEEK( entry->stringOffset ) ||
         FT_FRAME_ENTER( entry->stringLength ) )
      goto get_apple_string_error;

    r = (FT_String*)result;
    p = (FT_Char*)stream->cursor;

    for ( len = entry->stringLength; len > 0; len--, p++ )
    {
      if ( char_type( *p ) )
        *r++ = *p;
      else
      {
        if ( report_invalid_characters )
          FT_TRACE0(( "get_apple_string:"
                      " Character `%c' (0x%X) invalid in PS name string\n",
                      *p, *p ));
        break;
      }
    }
    if ( !len )
      *r = '\0';

    FT_FRAME_EXIT();

    if ( !len )
      return result;

  get_apple_string_error:
    FT_FREE( result );

    entry->stringOffset = 0;
    entry->stringLength = 0;
    FT_FREE( entry->string );

    return NULL;
  }